

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

ExactFloat * __thiscall ExactFloat::operator=(ExactFloat *this,ExactFloat *b)

{
  if (this != b) {
    this->sign_ = b->sign_;
    this->bn_exp_ = b->bn_exp_;
    BN_copy((BIGNUM *)(this->bn_).bn_,(BIGNUM *)(b->bn_).bn_);
  }
  return this;
}

Assistant:

ExactFloat& ExactFloat::operator=(const ExactFloat& b) {
  if (this != &b) {
    sign_ = b.sign_;
    bn_exp_ = b.bn_exp_;
    BN_copy(bn_.get(), b.bn_.get());
  }
  return *this;
}